

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

t_gobj * canvas_findhitbox(_glist *x,int xpos,int ypos,int *x1p,int *y1p,int *x2p,int *y2p)

{
  int iVar1;
  t_selection *local_58;
  t_selection *sel;
  int y2;
  int x2;
  int y1;
  int x1;
  t_gobj *rval;
  t_gobj *y;
  int *x2p_local;
  int *y1p_local;
  int *x1p_local;
  int ypos_local;
  int xpos_local;
  _glist *x_local;
  
  _y1 = (t_gobj *)0x0;
  *x1p = -0x7fffffff;
  y = (t_gobj *)x2p;
  x2p_local = y1p;
  y1p_local = x1p;
  x1p_local._0_4_ = ypos;
  x1p_local._4_4_ = xpos;
  _ypos_local = x;
  for (rval = x->gl_list; rval != (t_gobj *)0x0; rval = rval->g_next) {
    iVar1 = canvas_hitbox(_ypos_local,rval,x1p_local._4_4_,(int)x1p_local,&x2,&y2,
                          (int *)((long)&sel + 4),(int *)&sel);
    if ((iVar1 != 0) && (*y1p_local < x2)) {
      *y1p_local = x2;
      *x2p_local = y2;
      *(undefined4 *)&y->g_pd = sel._4_4_;
      *y2p = (int)sel;
      _y1 = rval;
    }
  }
  if ((((_ypos_local->gl_editor != (t_editor *)0x0) &&
       (_ypos_local->gl_editor->e_selection != (t_selection *)0x0)) &&
      (_ypos_local->gl_editor->e_selection->sel_next != (_selection *)0x0)) &&
     (iVar1 = glist_isselected(_ypos_local,(t_gobj *)0x0), iVar1 == 0)) {
    for (local_58 = _ypos_local->gl_editor->e_selection; local_58 != (t_selection *)0x0;
        local_58 = local_58->sel_next) {
      iVar1 = canvas_hitbox(_ypos_local,local_58->sel_what,x1p_local._4_4_,(int)x1p_local,&x2,&y2,
                            (int *)((long)&sel + 4),(int *)&sel);
      if (iVar1 != 0) {
        *y1p_local = x2;
        *x2p_local = y2;
        *(undefined4 *)&y->g_pd = sel._4_4_;
        *y2p = (int)sel;
        _y1 = local_58->sel_what;
      }
    }
  }
  return _y1;
}

Assistant:

static t_gobj *canvas_findhitbox(t_canvas *x, int xpos, int ypos,
    int *x1p, int *y1p, int *x2p, int *y2p)
{
    t_gobj *y, *rval = 0;
    int x1, y1, x2, y2;
    *x1p = -0x7fffffff;
    for (y = x->gl_list; y; y = y->g_next)
    {
        if (canvas_hitbox(x, y, xpos, ypos, &x1, &y1, &x2, &y2)
            && (x1 > *x1p))
                *x1p = x1, *y1p = y1, *x2p = x2, *y2p = y2, rval = y;
    }
        /* if there are at least two selected objects, we'd prefer
           to find a selected one (never mind which) to the one we got. */
    if (x->gl_editor && x->gl_editor->e_selection &&
        x->gl_editor->e_selection->sel_next && !glist_isselected(x, y))
    {
        t_selection *sel;
        for (sel = x->gl_editor->e_selection; sel; sel = sel->sel_next)
            if (canvas_hitbox(x, sel->sel_what, xpos, ypos, &x1, &y1, &x2, &y2))
                *x1p = x1, *y1p = y1, *x2p = x2, *y2p = y2,
                    rval = sel->sel_what;
    }
    return (rval);
}